

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O2

CTcSymbol * CTcSymMetaclassBase::read_from_sym_file(CVmFile *fp)

{
  undefined1 *puVar1;
  tctarg_obj_id_t class_obj;
  CTcPrsSymtab *this;
  byte bVar2;
  int iVar3;
  char *__s;
  size_t sVar4;
  CTcSymMetaclass *this_00;
  char *siz;
  char id [256];
  
  __s = CTcSymbolBase::base_read_from_sym_file(fp);
  if (__s == (char *)0x0) {
    this_00 = (CTcSymMetaclass *)0x0;
  }
  else {
    bVar2 = CVmFile::read_byte(fp);
    CVmFile::read_bytes(fp,id,(ulong)bVar2);
    this = G_prs->global_symtab_;
    sVar4 = strlen(__s);
    siz = __s;
    this_00 = (CTcSymMetaclass *)CTcPrsSymtab::find(this,__s,sVar4);
    if ((this_00 == (CTcSymMetaclass *)0x0) ||
       (*(int *)&((CVmHashEntry *)
                 &(this_00->super_CTcSymMetaclassBase).super_CTcSymbol.super_CTcSymbolBase)->
                 field_0x24 != 9)) {
      this_00 = (CTcSymMetaclass *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x60,(size_t)siz);
      sVar4 = strlen(__s);
      class_obj = G_cg->next_obj_;
      G_cg->next_obj_ = class_obj + 1;
      CTcSymMetaclass::CTcSymMetaclass(this_00,__s,sVar4,0,0,class_obj);
      puVar1 = &(this_00->super_CTcSymMetaclassBase).field_0x58;
      *puVar1 = *puVar1 | 1;
      iVar3 = CTcGenTarg::find_or_add_meta(G_cg,id,(ulong)bVar2,this_00);
      (this_00->super_CTcSymMetaclassBase).meta_idx_ = iVar3;
    }
  }
  return (CTcSymbol *)this_00;
}

Assistant:

CTcSymbol *CTcSymMetaclassBase::read_from_sym_file(class CVmFile *fp)
{
    /* read the symbol name */
    const char *txt;
    if ((txt = base_read_from_sym_file(fp)) == 0)
        return 0;

    /* read the metaclass ID string */
    char id[256];
    size_t idlen = (uchar)fp->read_byte();
    fp->read_bytes(id, idlen);

    /* if the symbol is already defined, return the existing copy */
    CTcSymbol *old_sym = G_prs->get_global_symtab()->find(txt, strlen(txt));
    if (old_sym != 0 && old_sym->get_type() == TC_SYM_METACLASS)
        return old_sym;

    /* create a new external metaclass symbol */
    CTcSymMetaclass *sym = new CTcSymMetaclass(
        txt, strlen(txt), FALSE, 0, G_cg->new_obj_id());

    /* mark it as external */
    sym->set_ext(TRUE);

    /* add it to the metaclass table */
    int idx = G_cg->find_or_add_meta(id, idlen, sym);

    /* set the index in the symbol */
    sym->set_meta_idx(idx);

    /* return the new symbol */
    return sym;
}